

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* lest::split_arguments
            (pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *__return_storage_ptr__,texts *args)

{
  options __x;
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  bool bVar8;
  bool bVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  runtime_error *this;
  undefined1 uVar15;
  pointer pbVar16;
  seed_t local_1f4;
  int local_1f0;
  text val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  text opt;
  texts in;
  runtime_error local_158 [16];
  undefined1 local_148 [64];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  text local_f0;
  text local_d0;
  text local_b0;
  text local_90;
  text local_70;
  text arg;
  
  in.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  in.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  in.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pbVar16 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  bVar1 = true;
  local_1f0 = 1;
  uVar3 = 0;
  uVar4 = 0;
  uVar6 = 0;
  uVar5 = 0;
  uVar7 = 0;
  bVar9 = false;
  uVar10 = 0;
  uVar13 = 0;
  uVar14 = 0;
  uVar11 = 0;
  uVar12 = 0;
  local_1f4 = 0;
  uVar2 = 0;
  do {
    if (pbVar16 ==
        (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      uVar15 = 1;
      if (!bVar9) {
        uVar15 = uVar10;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_108,&in);
      __x.abort = (bool)uVar3;
      __x.help = (bool)uVar2;
      __x.count = (bool)uVar4;
      __x.list = (bool)uVar6;
      __x.tags = (bool)uVar5;
      __x.time = (bool)uVar7;
      __x.pass = (bool)uVar15;
      __x.zen = (bool)uVar10;
      __x.random = (bool)uVar14;
      __x.lexical = (bool)uVar13;
      __x.verbose = (bool)uVar11;
      __x.version = (bool)uVar12;
      __x.repeat = local_1f0;
      __x.seed = local_1f4;
      std::
      make_pair<lest::options,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_148,__x,&local_108);
      std::
      pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::pair(__return_storage_ptr__,
             (pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_148);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_148 + 0x18));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_108);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&in);
      return __return_storage_ptr__;
    }
    opt._M_dataplus._M_p = (pointer)&opt.field_2;
    opt._M_string_length = 0;
    opt.field_2._M_local_buf[0] = '\0';
    val._M_dataplus._M_p = (pointer)&val.field_2;
    val._M_string_length = 0;
    val.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string((string *)&arg,(string *)pbVar16);
    std::__cxx11::string::string((string *)&local_70,(string *)&arg);
    split_option((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_148,&local_70);
    local_1b8._M_string_length = (size_type)&val;
    local_1b8._M_dataplus._M_p = (pointer)&opt;
    Tie<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator=((Tie<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_1b8,
                (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_148);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_148);
    std::__cxx11::string::_M_dispose();
    if ((bVar1) && (*opt._M_dataplus._M_p == '-')) {
      bVar1 = std::operator==(&opt,"--");
      if (bVar1) goto LAB_00105a62;
      bVar1 = std::operator==(&opt,"-h");
      if (bVar1) {
LAB_00105a4a:
        bVar1 = true;
        uVar2 = 1;
      }
      else {
        bVar1 = std::operator==("--help",&opt);
        if (bVar1) goto LAB_00105a4a;
        bVar1 = std::operator==(&opt,"-a");
        if (bVar1) {
LAB_00105ab4:
          bVar1 = true;
          uVar3 = 1;
        }
        else {
          bVar1 = std::operator==("--abort",&opt);
          if (bVar1) goto LAB_00105ab4;
          bVar1 = std::operator==(&opt,"-c");
          if (bVar1) {
LAB_00105ae8:
            bVar1 = true;
            uVar4 = 1;
          }
          else {
            bVar1 = std::operator==("--count",&opt);
            if (bVar1) goto LAB_00105ae8;
            bVar1 = std::operator==(&opt,"-g");
            if (bVar1) {
LAB_00105b1f:
              bVar1 = true;
              uVar5 = 1;
            }
            else {
              bVar1 = std::operator==("--list-tags",&opt);
              if (bVar1) goto LAB_00105b1f;
              bVar1 = std::operator==(&opt,"-l");
              if (bVar1) {
LAB_00105b56:
                bVar1 = true;
                uVar6 = 1;
              }
              else {
                bVar1 = std::operator==("--list-tests",&opt);
                if (bVar1) goto LAB_00105b56;
                bVar1 = std::operator==(&opt,"-t");
                if (bVar1) {
LAB_00105b8d:
                  bVar1 = true;
                  uVar7 = 1;
                }
                else {
                  bVar1 = std::operator==("--time",&opt);
                  if (bVar1) goto LAB_00105b8d;
                  bVar8 = std::operator==(&opt,"-p");
                  bVar1 = true;
                  if (bVar8) {
LAB_00105bc1:
                    bVar9 = true;
                  }
                  else {
                    bVar8 = std::operator==("--pass",&opt);
                    if (bVar8) goto LAB_00105bc1;
                    bVar1 = std::operator==(&opt,"-z");
                    if (bVar1) {
LAB_00105bf8:
                      bVar1 = true;
                      uVar10 = 1;
                    }
                    else {
                      bVar1 = std::operator==("--pass-zen",&opt);
                      if (bVar1) goto LAB_00105bf8;
                      bVar1 = std::operator==(&opt,"-v");
                      if (bVar1) {
LAB_00105c2f:
                        bVar1 = true;
                        uVar11 = 1;
                      }
                      else {
                        bVar1 = std::operator==("--verbose",&opt);
                        if (bVar1) goto LAB_00105c2f;
                        bVar8 = std::operator==("--version",&opt);
                        bVar1 = true;
                        if (bVar8) {
                          uVar12 = 1;
                        }
                        else {
                          bVar8 = std::operator==(&opt,"--order");
                          if (bVar8) {
                            bVar8 = std::operator==("declared",&val);
                            if (bVar8) goto LAB_00105a65;
                          }
                          bVar8 = std::operator==(&opt,"--order");
                          if (bVar8) {
                            bVar8 = std::operator==("lexical",&val);
                            if (!bVar8) goto LAB_00105cb7;
                            uVar13 = 1;
LAB_00105ce5:
                            bVar1 = true;
                          }
                          else {
LAB_00105cb7:
                            bVar8 = std::operator==(&opt,"--order");
                            if (bVar8) {
                              bVar8 = std::operator==("random",&val);
                              if (bVar8) {
                                uVar14 = 1;
                                goto LAB_00105ce5;
                              }
                            }
                            bVar8 = std::operator==(&opt,"--random-seed");
                            if (bVar8) {
                              std::__cxx11::string::string
                                        ((string *)local_148,"--random-seed",(allocator *)&local_1b8
                                        );
                              std::__cxx11::string::string((string *)&local_90,(string *)local_148);
                              std::__cxx11::string::string((string *)&local_b0,(string *)&val);
                              local_1f4 = seed(&local_90,&local_b0);
                              std::__cxx11::string::_M_dispose();
                              std::__cxx11::string::_M_dispose();
                              std::__cxx11::string::_M_dispose();
                            }
                            else {
                              bVar8 = std::operator==(&opt,"--repeat");
                              if (!bVar8) {
                                this = (runtime_error *)__cxa_allocate_exception(0x10);
                                std::operator+(&local_1b8,"unrecognised option \'",&opt);
                                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)local_148,&local_1b8,"\' (try option --help)");
                                std::runtime_error::runtime_error(local_158,(string *)local_148);
                                std::runtime_error::runtime_error(this,local_158);
                                __cxa_throw(this,&std::runtime_error::typeinfo,
                                            std::runtime_error::~runtime_error);
                              }
                              std::__cxx11::string::string
                                        ((string *)local_148,"--repeat",(allocator *)&local_1b8);
                              std::__cxx11::string::string((string *)&local_d0,(string *)local_148);
                              std::__cxx11::string::string((string *)&local_f0,(string *)&val);
                              local_1f0 = repeat(&local_d0,&local_f0);
                              std::__cxx11::string::_M_dispose();
                              std::__cxx11::string::_M_dispose();
                              std::__cxx11::string::_M_dispose();
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&in,&arg);
LAB_00105a62:
      bVar1 = false;
    }
LAB_00105a65:
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    pbVar16 = pbVar16 + 1;
  } while( true );
}

Assistant:

inline std::pair<options, texts>
split_arguments( texts args )
{
    options option; texts in;

    bool in_options = true;

    for ( texts::iterator pos = args.begin(); pos != args.end() ; ++pos )
    {
        text opt, val, arg = *pos;
        tie( opt, val ) = split_option( arg );

        if ( in_options )
        {
            if      ( opt[0] != '-'                             ) { in_options     = false;           }
            else if ( opt == "--"                               ) { in_options     = false; continue; }
            else if ( opt == "-h"      || "--help"       == opt ) { option.help    =  true; continue; }
            else if ( opt == "-a"      || "--abort"      == opt ) { option.abort   =  true; continue; }
            else if ( opt == "-c"      || "--count"      == opt ) { option.count   =  true; continue; }
            else if ( opt == "-g"      || "--list-tags"  == opt ) { option.tags    =  true; continue; }
            else if ( opt == "-l"      || "--list-tests" == opt ) { option.list    =  true; continue; }
            else if ( opt == "-t"      || "--time"       == opt ) { option.time    =  true; continue; }
            else if ( opt == "-p"      || "--pass"       == opt ) { option.pass    =  true; continue; }
            else if ( opt == "-z"      || "--pass-zen"   == opt ) { option.zen     =  true; continue; }
            else if ( opt == "-v"      || "--verbose"    == opt ) { option.verbose =  true; continue; }
            else if (                     "--version"    == opt ) { option.version =  true; continue; }
            else if ( opt == "--order" && "declared"     == val ) { /* by definition */   ; continue; }
            else if ( opt == "--order" && "lexical"      == val ) { option.lexical =  true; continue; }
            else if ( opt == "--order" && "random"       == val ) { option.random  =  true; continue; }
            else if ( opt == "--random-seed" ) { option.seed   = seed  ( "--random-seed", val ); continue; }
            else if ( opt == "--repeat"      ) { option.repeat = repeat( "--repeat"     , val ); continue; }
            else throw std::runtime_error( "unrecognised option '" + opt + "' (try option --help)" );
        }
        in.push_back( arg );
    }
    option.pass = option.pass || option.zen;

    return std::make_pair( option, in );
}